

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::NonMaximumSuppressionLayerParams
          (NonMaximumSuppressionLayerParams *this,NonMaximumSuppressionLayerParams *from)

{
  void *pvVar1;
  uint64 uVar2;
  float fVar3;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__NonMaximumSuppressionLayerParams_007295e0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->perclasssuppression_ = from->perclasssuppression_;
  fVar3 = from->scorethreshold_;
  uVar2 = from->maxboxes_;
  this->iouthreshold_ = from->iouthreshold_;
  this->scorethreshold_ = fVar3;
  this->maxboxes_ = uVar2;
  return;
}

Assistant:

NonMaximumSuppressionLayerParams::NonMaximumSuppressionLayerParams(const NonMaximumSuppressionLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&iouthreshold_, &from.iouthreshold_,
    reinterpret_cast<char*>(&perclasssuppression_) -
    reinterpret_cast<char*>(&iouthreshold_) + sizeof(perclasssuppression_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NonMaximumSuppressionLayerParams)
}